

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsGetPropertyNameFromId(JsPropertyIdRef propertyId,WCHAR **name)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JsErrorCode JVar4;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  JVar4 = JsErrorInvalidArgument;
  if ((propertyId != (JsPropertyIdRef)0x0) && (0xf < *(uint *)((long)propertyId + 8))) {
    if (name == (WCHAR **)0x0) {
      JVar4 = JsErrorNullArgument;
    }
    else {
      *name = (WCHAR *)0x0;
      JVar4 = JsErrorPropertyNotString;
      if (*(char *)((long)propertyId + 0x12) == '\0') {
        *name = (WCHAR *)((long)propertyId + 0x18);
        JVar4 = JsNoError;
      }
    }
  }
  if ((JVar4 == JsErrorInDisabledState) || (JVar4 == JsErrorNoCurrentContext)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0x89,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar4;
}

Assistant:

CHAKRA_API JsGetPropertyNameFromId(_In_ JsPropertyIdRef propertyId, _Outptr_result_z_ const WCHAR **name)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(name);
        *name = nullptr;

        Js::PropertyRecord const * propertyRecord = (Js::PropertyRecord const *)propertyId;

        if (propertyRecord->IsSymbol())
        {
            return JsErrorPropertyNotString;
        }

        *name = propertyRecord->GetBuffer();
        return JsNoError;
    });
}